

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

void basist::astc_set_bits(uint32_t *pOutput,int *bit_pos,uint32_t value,uint32_t total_bits)

{
  byte *pbVar1;
  uint uVar2;
  uint32_t uVar3;
  
  for (; total_bits != 0; total_bits = total_bits - uVar3) {
    uVar2 = *bit_pos & 7;
    uVar3 = 8 - uVar2;
    if ((int)total_bits < (int)uVar3) {
      uVar3 = total_bits;
    }
    pbVar1 = (byte *)((long)pOutput + (long)(*bit_pos >> 3));
    *pbVar1 = *pbVar1 | (byte)(value << (sbyte)uVar2);
    *bit_pos = *bit_pos + uVar3;
    value = value >> ((byte)uVar3 & 0x1f);
  }
  return;
}

Assistant:

static inline void astc_set_bits(uint32_t* pOutput, int& bit_pos, uint32_t value, uint32_t total_bits)
	{
		uint8_t* pBytes = reinterpret_cast<uint8_t*>(pOutput);

		while (total_bits)
		{
			const uint32_t bits_to_write = basisu::minimum<int>(total_bits, 8 - (bit_pos & 7));

			pBytes[bit_pos >> 3] |= static_cast<uint8_t>(value << (bit_pos & 7));

			bit_pos += bits_to_write;
			total_bits -= bits_to_write;
			value >>= bits_to_write;
		}
	}